

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O0

void __thiscall
tao::pegtl::internal::
memory_input_base<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
::memory_input_base<char_const(&)[6]>
          (memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,char *in_begin,char *in_end,char (*in_source) [6])

{
  allocator<char> *in_RCX;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  allocator<char> local_21;
  
  *in_RDI = in_RSI;
  iterator::iterator((iterator *)(in_RDI + 1),(char *)in_RSI);
  in_RDI[5] = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,in_RDX,in_RCX);
  std::allocator<char>::~allocator(&local_21);
  return;
}

Assistant:

memory_input_base( const char* in_begin, const char* in_end, T&& in_source ) noexcept( std::is_nothrow_constructible< Source, T&& >::value )
               : m_begin( in_begin ),
                 m_current( in_begin ),
                 m_end( in_end ),
                 m_source( std::forward< T >( in_source ) )
            {
            }